

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VMOV_imm_sp(DisasContext_conflict1 *s,arg_VMOV_imm_sp *a)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i32 pTVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xe0) == 0) {
LAB_0065e7dc:
    _Var2 = false;
  }
  else {
    tcg_ctx = s->uc->tcg_ctx;
    iVar4 = s->vec_len;
    uVar5 = a->vd;
    if ((uVar1 & 0xf000000) == 0) {
      if (iVar4 != 0) goto LAB_0065e7dc;
      iVar6 = 0;
      if (s->vec_stride != 0) {
        return false;
      }
      _Var2 = full_vfp_access_check(s,false);
      iVar4 = 0;
      if (!_Var2) {
        return true;
      }
    }
    else {
      iVar6 = 0;
      _Var2 = full_vfp_access_check(s,false);
      if (!_Var2) {
        return true;
      }
      if (0 < iVar4) {
        if ((uVar5 & 0x18) == 0) {
          iVar6 = 0;
          iVar4 = 0;
        }
        else {
          iVar6 = s->vec_stride + 1;
        }
      }
    }
    uVar1 = a->imm;
    pTVar3 = tcg_const_i32_aarch64
                       (tcg_ctx,(uint)((uVar1 & 0x40) == 0) * 0x2000000 +
                                ((uVar1 & 0x3f) << 0x13 | (uVar1 & 0xffffff80) << 0x18) + 0x3e000000
                       );
    while( true ) {
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar3 + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                          (ulong)(uVar5 * 4 & 4) +
                          ((ulong)(uVar5 * 4 & 8) | (ulong)(uVar5 >> 2) << 8) + 0xc10);
      bVar7 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar7) break;
      uVar5 = uVar5 & 0xfffffff8 | uVar5 + iVar6 & 7;
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool trans_VMOV_imm_sp(DisasContext *s, arg_VMOV_imm_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpsp_v3, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;
        }
    }

    fd = tcg_const_i32(tcg_ctx, vfp_expand_imm(MO_32, a->imm));

    for (;;) {
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
    }

    tcg_temp_free_i32(tcg_ctx, fd);
    return true;
}